

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowDecorations
               (ImGuiWindow *window,ImRect *title_bar_rect,bool title_bar_is_highlight,
               int resize_grip_count,ImU32 *resize_grip_col,float resize_grip_draw_size)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  int in_ECX;
  byte in_DL;
  ImVec2 *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar3;
  ImVec2 corner;
  ImGuiResizeGripDef *grip;
  int resize_grip_n;
  ImRect menu_bar_rect;
  ImU32 title_bar_col_1;
  float alpha;
  bool override_alpha;
  ImU32 bg_col;
  ImU32 title_bar_col;
  float backup_border_size;
  float window_border_size;
  float window_rounding;
  ImGuiWindowFlags flags;
  ImGuiStyle *style;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffe28;
  ImU32 in_stack_fffffffffffffe2c;
  ImDrawList *in_stack_fffffffffffffe30;
  ImRect *in_stack_fffffffffffffe38;
  ImGuiWindow *in_stack_fffffffffffffe40;
  ImVec2 *in_stack_fffffffffffffe48;
  int a_max_of_12;
  ImDrawList *in_stack_fffffffffffffe50;
  undefined8 uVar4;
  ImVec2 *pIVar5;
  ImDrawList *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe88;
  ImVec2 *this;
  undefined4 in_stack_fffffffffffffe90;
  ImU32 in_stack_fffffffffffffe94;
  ImVec2 in_stack_fffffffffffffe98;
  ImVec2 in_stack_fffffffffffffea0;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImGuiResizeGripDef *local_e8;
  uint local_dc;
  ImVec2 local_d8;
  ImVec2 in_stack_ffffffffffffff30;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImRect local_a8;
  undefined1 local_98 [16];
  ImU32 local_88;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  float local_6c;
  undefined1 local_65;
  ImU32 local_64;
  ImVec2 local_60;
  ImVec2 local_58;
  ImU32 local_4c;
  float local_48;
  float local_44;
  float local_40;
  uint local_3c;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  float local_24;
  int local_18;
  byte local_11;
  ImVec2 *local_10;
  long local_8;
  
  pIVar1 = GImGui;
  fVar3 = (float)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_11 = in_DL & 1;
  local_30 = GImGui;
  local_38 = &GImGui->Style;
  local_3c = *(uint *)(in_RDI + 0xc);
  *(undefined1 *)(in_RDI + 0x83) = 0;
  local_40 = *(float *)(in_RDI + 0x40);
  local_44 = *(float *)(in_RDI + 0x44);
  if ((*(byte *)(in_RDI + 0x81) & 1) == 0) {
    local_24 = in_XMM0_Da;
    local_18 = in_ECX;
    local_8 = in_RDI;
    if ((local_3c & 0x80) == 0) {
      GetWindowBgColorIdxFromFlags(local_3c);
      local_64 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                             SUB84(in_stack_fffffffffffffe40,0));
      local_6c = 1.0;
      local_65 = ((local_30->NextWindowData).Flags & 0x40U) != 0;
      if ((bool)local_65) {
        local_6c = (local_30->NextWindowData).BgAlphaVal;
        uVar2 = local_64 & 0xffffff;
        fVar3 = ImSaturate(local_6c);
        local_64 = uVar2 | (int)(fVar3 * 255.0 + 0.5) << 0x18;
      }
      fVar3 = ImGuiWindow::TitleBarHeight(in_stack_fffffffffffffe40);
      ImVec2::ImVec2(&local_7c,0.0,fVar3);
      local_74 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (ImVec2 *)0x1c6bf3);
      local_84 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (ImVec2 *)0x1c6c14);
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (ImVec2 *)in_stack_fffffffffffffe40,
                 (ImU32)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 SUB84(in_stack_fffffffffffffe38,0),
                 (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    }
    if ((local_3c & 1) == 0) {
      local_88 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                             SUB84(in_stack_fffffffffffffe40,0));
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (ImVec2 *)in_stack_fffffffffffffe40,
                 (ImU32)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 SUB84(in_stack_fffffffffffffe38,0),
                 (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    }
    if ((local_3c & 0x400) != 0) {
      local_98 = (undefined1  [16])ImGuiWindow::MenuBarRect(in_stack_fffffffffffffe40);
      local_a8 = ImGuiWindow::Rect((ImGuiWindow *)0x1c6d2c);
      pIVar5 = (ImVec2 *)local_98;
      ImRect::ClipWith((ImRect *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      uVar4 = *(undefined8 *)(local_8 + 0x2b0);
      this = &local_b8;
      fVar3 = 0.0;
      ImVec2::ImVec2(this,local_44,0.0);
      local_b0 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (ImVec2 *)0x1c6d9f);
      ImVec2::ImVec2(&local_c8,local_44,fVar3);
      local_c0 = ::operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                             ,(ImVec2 *)0x1c6dd8);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                  SUB84(in_stack_fffffffffffffe40,0));
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (ImVec2 *)in_stack_fffffffffffffe40,
                 (ImU32)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 SUB84(in_stack_fffffffffffffe38,0),
                 (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      if ((0.0 < local_38->FrameBorderSize) &&
         ((float)local_98._12_4_ < *(float *)(local_8 + 0x14) + *(float *)(local_8 + 0x1c))) {
        in_stack_fffffffffffffe60 = (ImDrawList *)local_98;
        in_stack_ffffffffffffff30 =
             ImRect::GetBL((ImRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        local_d8 = ImRect::GetBR((ImRect *)in_stack_fffffffffffffe60);
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                    SUB84(in_stack_fffffffffffffe40,0));
        ImDrawList::AddLine((ImDrawList *)CONCAT44(fVar3,in_stack_fffffffffffffe90),this,pIVar5,
                            (ImU32)((ulong)uVar4 >> 0x20),(float)uVar4);
      }
    }
    if ((*(byte *)(local_8 + 0x7c) & 1) != 0) {
      Scrollbar((ImGuiAxis)((ulong)in_stack_fffffffffffffe60 >> 0x20));
    }
    if ((*(byte *)(local_8 + 0x7d) & 1) != 0) {
      Scrollbar((ImGuiAxis)((ulong)in_stack_fffffffffffffe60 >> 0x20));
    }
    if ((local_3c & 2) == 0) {
      for (local_dc = 0; (int)local_dc < local_18; local_dc = local_dc + 1) {
        local_e8 = resize_grip_def + (int)local_dc;
        a_max_of_12 = (int)((ulong)(local_8 + 0x10) >> 0x20);
        local_f8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                             ,(ImVec2 *)0x1c6fad);
        local_f0 = ImLerp(&in_stack_fffffffffffffe38->Min,(ImVec2 *)in_stack_fffffffffffffe30,
                          (ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        uVar4 = *(undefined8 *)(local_8 + 0x2b0);
        pIVar5 = &local_e8->InnerDir;
        if ((local_dc & 1) == 0) {
          ImVec2::ImVec2(&local_110,local_24,local_44);
        }
        else {
          ImVec2::ImVec2(&local_110,local_44,local_24);
        }
        local_108 = ::operator*((ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                (ImVec2 *)0x1c705f);
        local_100 = operator+((ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                              (ImVec2 *)0x1c707d);
        ImDrawList::PathLineTo
                  (in_stack_fffffffffffffe30,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        in_stack_fffffffffffffe38 = *(ImRect **)(local_8 + 0x2b0);
        if ((local_dc & 1) == 0) {
          ImVec2::ImVec2(&local_128,local_44,local_24);
        }
        else {
          ImVec2::ImVec2(&local_128,local_24,local_44);
        }
        local_120 = ::operator*((ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                (ImVec2 *)0x1c711e);
        local_118 = operator+((ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                              (ImVec2 *)0x1c713c);
        ImDrawList::PathLineTo
                  (in_stack_fffffffffffffe30,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        in_stack_fffffffffffffe30 = *(ImDrawList **)(local_8 + 0x2b0);
        ImVec2::ImVec2(&local_130,(local_e8->InnerDir).x * (local_40 + local_44) + local_f0.x,
                       (local_e8->InnerDir).y * (local_40 + local_44) + local_f0.y);
        ImDrawList::PathArcToFast
                  (in_stack_fffffffffffffe60,pIVar5,(float)((ulong)uVar4 >> 0x20),(int)uVar4,
                   a_max_of_12);
        ImDrawList::PathFillConvex(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      }
    }
    RenderWindowOuterBorders((ImGuiWindow *)in_stack_ffffffffffffff30);
  }
  else {
    local_48 = (pIVar1->Style).FrameBorderSize;
    (pIVar1->Style).FrameBorderSize = *(float *)(in_RDI + 0x44);
    local_10 = in_RSI;
    local_4c = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                           SUB84(in_stack_fffffffffffffe40,0));
    local_58 = *local_10;
    local_60 = local_10[1];
    RenderFrame(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                SUB41((uint)in_stack_fffffffffffffe90 >> 0x18,0),fVar3);
    (local_30->Style).FrameBorderSize = local_48;
  }
  return;
}

Assistant:

void ImGui::RenderWindowDecorations(ImGuiWindow* window, const ImRect& title_bar_rect, bool title_bar_is_highlight, int resize_grip_count, const ImU32 resize_grip_col[4], float resize_grip_draw_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImGuiWindowFlags flags = window->Flags;

    // Ensure that ScrollBar doesn't read last frame's SkipItems
    window->SkipItems = false;

    // Draw window + handle manual resize
    // As we highlight the title bar when want_focus is set, multiple reappearing windows will have have their title bar highlighted on their reappearing frame.
    const float window_rounding = window->WindowRounding;
    const float window_border_size = window->WindowBorderSize;
    if (window->Collapsed)
    {
        // Title bar only
        float backup_border_size = style.FrameBorderSize;
        g.Style.FrameBorderSize = window->WindowBorderSize;
        ImU32 title_bar_col = GetColorU32((title_bar_is_highlight && !g.NavDisableHighlight) ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBgCollapsed);
        RenderFrame(title_bar_rect.Min, title_bar_rect.Max, title_bar_col, true, window_rounding);
        g.Style.FrameBorderSize = backup_border_size;
    }
    else
    {
        // Window background
        if (!(flags & ImGuiWindowFlags_NoBackground))
        {
            ImU32 bg_col = GetColorU32(GetWindowBgColorIdxFromFlags(flags));
            bool override_alpha = false;
            float alpha = 1.0f;
            if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasBgAlpha)
            {
                alpha = g.NextWindowData.BgAlphaVal;
                override_alpha = true;
            }
            if (override_alpha)
                bg_col = (bg_col & ~IM_COL32_A_MASK) | (IM_F32_TO_INT8_SAT(alpha) << IM_COL32_A_SHIFT);
            window->DrawList->AddRectFilled(window->Pos + ImVec2(0, window->TitleBarHeight()), window->Pos + window->Size, bg_col, window_rounding, (flags & ImGuiWindowFlags_NoTitleBar) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Bot);
        }

        // Title bar
        if (!(flags & ImGuiWindowFlags_NoTitleBar))
        {
            ImU32 title_bar_col = GetColorU32(title_bar_is_highlight ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg);
            window->DrawList->AddRectFilled(title_bar_rect.Min, title_bar_rect.Max, title_bar_col, window_rounding, ImDrawCornerFlags_Top);
        }

        // Menu bar
        if (flags & ImGuiWindowFlags_MenuBar)
        {
            ImRect menu_bar_rect = window->MenuBarRect();
            menu_bar_rect.ClipWith(window->Rect());  // Soft clipping, in particular child window don't have minimum size covering the menu bar so this is useful for them.
            window->DrawList->AddRectFilled(menu_bar_rect.Min + ImVec2(window_border_size, 0), menu_bar_rect.Max - ImVec2(window_border_size, 0), GetColorU32(ImGuiCol_MenuBarBg), (flags & ImGuiWindowFlags_NoTitleBar) ? window_rounding : 0.0f, ImDrawCornerFlags_Top);
            if (style.FrameBorderSize > 0.0f && menu_bar_rect.Max.y < window->Pos.y + window->Size.y)
                window->DrawList->AddLine(menu_bar_rect.GetBL(), menu_bar_rect.GetBR(), GetColorU32(ImGuiCol_Border), style.FrameBorderSize);
        }

        // Scrollbars
        if (window->ScrollbarX)
            Scrollbar(ImGuiAxis_X);
        if (window->ScrollbarY)
            Scrollbar(ImGuiAxis_Y);

        // Render resize grips (after their input handling so we don't have a frame of latency)
        if (!(flags & ImGuiWindowFlags_NoResize))
        {
            for (int resize_grip_n = 0; resize_grip_n < resize_grip_count; resize_grip_n++)
            {
                const ImGuiResizeGripDef& grip = resize_grip_def[resize_grip_n];
                const ImVec2 corner = ImLerp(window->Pos, window->Pos + window->Size, grip.CornerPosN);
                window->DrawList->PathLineTo(corner + grip.InnerDir * ((resize_grip_n & 1) ? ImVec2(window_border_size, resize_grip_draw_size) : ImVec2(resize_grip_draw_size, window_border_size)));
                window->DrawList->PathLineTo(corner + grip.InnerDir * ((resize_grip_n & 1) ? ImVec2(resize_grip_draw_size, window_border_size) : ImVec2(window_border_size, resize_grip_draw_size)));
                window->DrawList->PathArcToFast(ImVec2(corner.x + grip.InnerDir.x * (window_rounding + window_border_size), corner.y + grip.InnerDir.y * (window_rounding + window_border_size)), window_rounding, grip.AngleMin12, grip.AngleMax12);
                window->DrawList->PathFillConvex(resize_grip_col[resize_grip_n]);
            }
        }

        // Borders
        RenderWindowOuterBorders(window);
    }
}